

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

Benchmark * __thiscall
benchmark::internal::Benchmark::Ranges
          (Benchmark *this,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *ranges)

{
  pointer pvVar1;
  ulong uVar2;
  CheckHandler CStack_18;
  
  pvVar1 = (this->imp_->args_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((pvVar1 != (this->imp_->args_).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) &&
      (uVar2 = (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start, (int)(~uVar2 >> 2) != 0)) &&
     ((int)(uVar2 >> 2) != (int)((ulong)(*(long *)(ranges + 8) - *(long *)ranges) >> 3))) {
    CheckHandler::CheckHandler
              (&CStack_18,
               "imp_->ArgsCnt() == -1 || imp_->ArgsCnt() == static_cast<int>(ranges.size())",
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
               ,"Ranges",0x2b4);
    CheckHandler::~CheckHandler(&CStack_18);
  }
  GetNullLogInstance();
  BenchmarkImp::Ranges(this->imp_,ranges);
  return this;
}

Assistant:

Benchmark* Benchmark::Ranges(const std::vector<std::pair<int, int>>& ranges)
{
  CHECK(imp_->ArgsCnt() == -1 || imp_->ArgsCnt() == static_cast<int>(ranges.size()));
  imp_->Ranges(ranges);
  return this;
}